

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

bool CB_ADF::test_adf_sequence(multi_ex *ec_seq)

{
  ulong uVar1;
  size_type sVar2;
  reference ppeVar3;
  size_t sVar4;
  undefined8 uVar5;
  cb_class *pcVar6;
  vector<example_*,_std::allocator<example_*>_> *in_RDI;
  stringstream __msg_1;
  stringstream __msg;
  example *ec;
  size_t k;
  uint32_t count;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  undefined1 uVar7;
  int in_stack_fffffffffffffc74;
  char *in_stack_fffffffffffffc78;
  vw_exception *in_stack_fffffffffffffc80;
  stringstream local_370 [16];
  ostream local_360;
  undefined1 local_1e1;
  stringstream local_1b0 [16];
  ostream local_1a0;
  value_type local_28;
  ulong local_20;
  int local_14;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  bool local_1;
  
  local_14 = 0;
  local_20 = 0;
  local_10 = in_RDI;
  while( true ) {
    uVar1 = local_20;
    sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(local_10);
    if (sVar2 <= uVar1) {
      if (local_14 == 0) {
        local_1 = true;
      }
      else {
        if (local_14 != 1) {
          std::__cxx11::stringstream::stringstream(local_370);
          std::operator<<(&local_360,
                          "cb_adf: badly formatted example, only one line can have a cost");
          uVar7 = 1;
          uVar5 = __cxa_allocate_exception(0x38);
          std::__cxx11::stringstream::str();
          VW::vw_exception::vw_exception
                    (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc74,
                     (string *)CONCAT17(uVar7,in_stack_fffffffffffffc68));
          __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        local_1 = false;
      }
      return local_1;
    }
    ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,local_20);
    local_28 = *ppeVar3;
    sVar4 = v_array<CB::cb_class>::size((v_array<CB::cb_class> *)&(local_28->l).simple);
    if (1 < sVar4) break;
    sVar4 = v_array<CB::cb_class>::size((v_array<CB::cb_class> *)&(local_28->l).simple);
    if (sVar4 == 1) {
      pcVar6 = v_array<CB::cb_class>::operator[]((v_array<CB::cb_class> *)&(local_28->l).simple,0);
      if ((pcVar6->cost != 3.4028235e+38) || (NAN(pcVar6->cost))) {
        local_14 = local_14 + 1;
      }
    }
    local_20 = local_20 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::operator<<(&local_1a0,"cb_adf: badly formatted example, only one cost can be known.");
  local_1e1 = 1;
  uVar5 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc74,
             (string *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
  local_1e1 = 0;
  __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

bool test_adf_sequence(multi_ex& ec_seq)
{
  uint32_t count = 0;
  for (size_t k = 0; k < ec_seq.size(); k++)
  {
    example* ec = ec_seq[k];
    if (ec->l.cb.costs.size() > 1)
      THROW("cb_adf: badly formatted example, only one cost can be known.");

    if (ec->l.cb.costs.size() == 1 && ec->l.cb.costs[0].cost != FLT_MAX)
      count += 1;
  }
  if (count == 0)
    return true;
  else if (count == 1)
    return false;
  else
    THROW("cb_adf: badly formatted example, only one line can have a cost");
}